

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O2

int set_file_comment(char **argv)

{
  char *pcVar1;
  zip_t *pzVar2;
  FILE *__stream;
  int iVar3;
  ulonglong uVar4;
  size_t sVar5;
  undefined8 uVar6;
  int iVar7;
  
  iVar7 = 0;
  uVar4 = strtoull(*argv,(char **)0x0,10);
  pzVar2 = za;
  pcVar1 = argv[1];
  sVar5 = strlen(pcVar1);
  iVar3 = zip_file_set_comment(pzVar2,uVar4,pcVar1,sVar5 & 0xffff,0);
  __stream = _stderr;
  if (iVar3 < 0) {
    pcVar1 = argv[1];
    uVar6 = zip_strerror(za);
    fprintf(__stream,"can\'t set file comment at index \'%lu\' to \'%s\': %s\n",uVar4,pcVar1,uVar6);
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

static int
set_file_comment(char *argv[]) {
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    if (zip_file_set_comment(za, idx, argv[1], (zip_uint16_t)strlen(argv[1]), 0) < 0) {
        fprintf(stderr, "can't set file comment at index '%" PRIu64 "' to '%s': %s\n", idx, argv[1], zip_strerror(za));
        return -1;
    }
    return 0;
}